

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int jsonParseFindParents(JsonParse *pParse)

{
  u32 *puVar1;
  u32 *aUp;
  JsonParse *pParse_local;
  
  puVar1 = (u32 *)sqlite3_malloc64((ulong)pParse->nNode << 2);
  pParse->aUp = puVar1;
  if (puVar1 == (u32 *)0x0) {
    pParse->oom = '\x01';
    pParse_local._4_4_ = 7;
  }
  else {
    jsonParseFillInParentage(pParse,0,0);
    pParse_local._4_4_ = 0;
  }
  return pParse_local._4_4_;
}

Assistant:

static int jsonParseFindParents(JsonParse *pParse){
  u32 *aUp;
  assert( pParse->aUp==0 );
  aUp = pParse->aUp = sqlite3_malloc64( sizeof(u32)*pParse->nNode );
  if( aUp==0 ){
    pParse->oom = 1;
    return SQLITE_NOMEM;
  }
  jsonParseFillInParentage(pParse, 0, 0);
  return SQLITE_OK;
}